

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_compiler.hpp
# Opt level: O1

sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
boost::xpressive::
regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
::parse_group<char_const*>
          (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,
          regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
          *this,char **begin,char *end)

{
  error_info_container *peVar1;
  _Rb_tree_header *p_Var2;
  counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pcVar3;
  size_t sVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *peVar10;
  matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar11;
  undefined4 uVar12;
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sVar13;
  intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  iVar14;
  _Alloc_hider _Var15;
  size_type sVar16;
  compiler_token_type cVar17;
  int iVar18;
  tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  shared_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *psVar19;
  dynamic_xpression<boost::xpressive::detail::regex_byref_matcher<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  element_type *peVar20;
  long lVar21;
  matchable_ptr mVar22;
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar23;
  bool pure;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar24;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tmp_1;
  regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *in_R8;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tmp_3;
  undefined4 uVar25;
  undefined8 *puVar26;
  size_t *psVar27;
  compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
  *this_02;
  lookahead_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  lam;
  shared_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  impl;
  string_type name;
  char *tmp;
  undefined1 local_178 [8];
  undefined8 local_170;
  undefined1 local_168 [56];
  undefined8 local_130;
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  intrusive_ptr<const_boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  undefined1 local_e8 [24];
  undefined1 local_d0 [8];
  width local_c8;
  quant_enum local_c0;
  matchable_ptr local_b8;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmStack_b0;
  intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  alternates_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paStack_a0;
  undefined4 local_94;
  string_type local_90;
  char *local_70;
  intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::regex_byref_matcher<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  long local_60;
  compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
  *local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  bVar6 = true;
  local_128.pure_ = true;
  local_128.width_.value_ = 0;
  local_128.quant_ = quant_none;
  local_128.head_.xpr_.px =
       (matchable_ptr)
       (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  local_128.tail_ =
       (shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  local_128.alt_end_xpr_.px =
       (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  local_128.alternates_ =
       (alternates_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  local_d0[0] = true;
  local_c8.value_ = 0;
  local_c0 = quant_none;
  local_b8.px = (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0;
  pmStack_b0 = (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0;
  local_a8.px = (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0;
  paStack_a0 = (alternates_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0;
  local_70 = (char *)0x0;
  this_02 = (compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
             *)(this + 0x10);
  local_94 = *(undefined4 *)(this + 0x220);
  local_168._48_8_ = this;
  local_f0.px = (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)__return_storage_ptr__;
  cVar17 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           ::get_group_type<char_const*>(this_02,begin,end,&local_90);
  sVar16 = local_90._M_string_length;
  _Var15._M_p = local_90._M_dataplus._M_p;
  if (0xb < cVar17 - token_no_mark) {
    lVar21 = *(long *)local_168._48_8_;
    *(long *)local_168._48_8_ = lVar21 + 1;
    mVar22.px = (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)operator_new(0x18);
    uVar25 = (undefined4)(lVar21 + 1);
    *(undefined4 *)&(mVar22.px)->field_0xc = uVar25;
    (((_Rb_tree_header *)
     &(mVar22.px)->
      super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     )->_M_header)._M_color = _S_red;
    *(undefined ***)
     &(((enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&(mVar22.px)->
            super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )->refs_)._M_t._M_impl = &PTR__dynamic_xpression_00195838;
    psVar23 = detail::
              get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ();
    p_Var5 = (_Base_ptr)(psVar23->xpr_).px;
    mVar22.px[1].
    super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._vptr_matchable = (_func_int **)p_Var5;
    if (p_Var5 != (_Base_ptr)0x0) {
      LOCK();
      *(int *)&p_Var5->_M_parent = *(int *)&p_Var5->_M_parent + 1;
      UNLOCK();
    }
    LOCK();
    (((_Rb_tree_header *)
     &(mVar22.px)->
      super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     )->_M_header)._M_color =
         (((_Rb_tree_header *)
          &(mVar22.px)->
           super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )->_M_header)._M_color + _S_black;
    UNLOCK();
    LOCK();
    (((_Rb_tree_header *)
     &(mVar22.px)->
      super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     )->_M_header)._M_color =
         (((_Rb_tree_header *)
          &(mVar22.px)->
           super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )->_M_header)._M_color + _S_black;
    UNLOCK();
    LOCK();
    (((_Rb_tree_header *)
     &(mVar22.px)->
      super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     )->_M_header)._M_color =
         (((_Rb_tree_header *)
          &(mVar22.px)->
           super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )->_M_header)._M_color + _S_black;
    UNLOCK();
    LOCK();
    p_Var2 = (_Rb_tree_header *)
             &(mVar22.px)->
              super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ;
    (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color - _S_black;
    UNLOCK();
    if ((p_Var2->_M_header)._M_color == _S_red) {
      (**(code **)(*(long *)&(((enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&(mVar22.px)->
                                   super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )->refs_)._M_t._M_impl + 8))(mVar22.px);
    }
    LOCK();
    p_Var2 = (_Rb_tree_header *)
             &(mVar22.px)->
              super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ;
    (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color - _S_black;
    UNLOCK();
    if ((p_Var2->_M_header)._M_color == _S_red) {
      (**(code **)(*(long *)&(((enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&(mVar22.px)->
                                   super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )->refs_)._M_t._M_impl + 8))(mVar22.px);
    }
    peVar20 = (element_type *)(mVar22.px + 1);
    uVar12 = local_178._0_4_;
    local_128._0_4_ = uVar12 << 8;
    local_128._4_4_ = local_178._3_4_;
    local_128.width_.value_ = 0;
    local_128.quant_ = quant_fixed_width;
    if (local_128.head_.xpr_.px !=
        (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      LOCK();
      p_Var2 = (_Rb_tree_header *)((long)local_128.head_.xpr_.px + 8);
      (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color - _S_black;
      UNLOCK();
      if ((p_Var2->_M_header)._M_color == _S_red) {
        peVar10 = (enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_128.head_.xpr_.px;
        local_128.head_.xpr_.px = (matchable_ptr)(matchable_ptr)mVar22.px;
        (**(code **)(*(long *)&(peVar10->refs_)._M_t._M_impl + 8))();
        mVar22 = local_128.head_.xpr_.px;
      }
    }
    local_128.head_.xpr_.px = (matchable_ptr)(matchable_ptr)mVar22.px;
    iVar14.px = local_128.alt_end_xpr_.px;
    local_128.alt_end_xpr_.px =
         (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    local_128.tail_ =
         (shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)peVar20;
    if (iVar14.px !=
        (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      LOCK();
      pcVar3 = (counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)iVar14.px + 8);
      (pcVar3->count_).value_ = (pcVar3->count_).value_ + -1;
      UNLOCK();
      if ((pcVar3->count_).value_ == 0) {
        (*((iVar14.px)->
          super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).
          super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._vptr_matchable[1])();
      }
    }
    local_128.alternates_ =
         (alternates_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    mVar22.px = (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)operator_new(0x18);
    *(undefined4 *)&(mVar22.px)->field_0xc = uVar25;
    ((mVar22.px)->
    super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).count_.value_ = 0;
    ((mVar22.px)->
    super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._vptr_matchable = (_func_int **)&PTR__dynamic_xpression_001958d8;
    psVar23 = detail::
              get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ();
LAB_0012bab9:
    pmVar24 = (psVar23->xpr_).px;
    mVar22.px[1].
    super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._vptr_matchable = (_func_int **)pmVar24;
    if (pmVar24 !=
        (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      LOCK();
      (pmVar24->
      super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).count_.value_ =
           (pmVar24->
           super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ).count_.value_ + 1;
      UNLOCK();
    }
    LOCK();
    ((mVar22.px)->
    super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).count_.value_ =
         ((mVar22.px)->
         super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ).count_.value_ + 1;
    UNLOCK();
    LOCK();
    ((mVar22.px)->
    super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).count_.value_ =
         ((mVar22.px)->
         super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ).count_.value_ + 1;
    UNLOCK();
    LOCK();
    ((mVar22.px)->
    super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).count_.value_ =
         ((mVar22.px)->
         super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ).count_.value_ + 1;
    UNLOCK();
    LOCK();
    pcVar3 = &(mVar22.px)->
              super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ;
    (pcVar3->count_).value_ = (pcVar3->count_).value_ + -1;
    UNLOCK();
    if ((pcVar3->count_).value_ == 0) {
      (*((mVar22.px)->
        super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._vptr_matchable[1])(mVar22.px);
    }
    LOCK();
    pcVar3 = &(mVar22.px)->
              super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ;
    (pcVar3->count_).value_ = (pcVar3->count_).value_ + -1;
    UNLOCK();
    if ((pcVar3->count_).value_ == 0) {
      (*((mVar22.px)->
        super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._vptr_matchable[1])(mVar22.px);
    }
    pmVar24 = mVar22.px + 1;
    local_d0[0] = false;
    local_d0._5_3_ = local_178._4_3_;
    local_c8.value_ = 0;
    local_c0 = quant_none;
    local_d0._1_4_ = local_178._0_4_;
    if (local_b8.px !=
        (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      LOCK();
      pcVar3 = &(local_b8.px)->
                super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ;
      (pcVar3->count_).value_ = (pcVar3->count_).value_ + -1;
      UNLOCK();
      if ((pcVar3->count_).value_ == 0) {
        pmVar11 = &(local_b8.px)->
                   super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ;
        local_b8.px = mVar22.px;
        (*pmVar11->_vptr_matchable[1])();
        mVar22.px = local_b8.px;
      }
    }
    local_b8.px = mVar22.px;
    iVar14.px = local_a8.px;
    local_a8.px = (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0;
    pmStack_b0 = pmVar24;
    if (iVar14.px !=
        (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      LOCK();
      pcVar3 = &((iVar14.px)->
                super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ;
      (pcVar3->count_).value_ = (pcVar3->count_).value_ + -1;
      UNLOCK();
      if ((pcVar3->count_).value_ == 0) {
        (*((iVar14.px)->
          super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).
          super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._vptr_matchable[1])();
      }
    }
    paStack_a0 = (alternates_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0;
LAB_0012bb87:
    bVar6 = false;
switchD_0012b3dc_caseD_15:
    bVar7 = false;
LAB_0012bb8c:
    local_130 = local_130 & 0xffffffff00000000;
    goto LAB_0012bb94;
  }
  switch(cVar17) {
  case token_no_mark:
    local_70 = *begin;
    cVar17 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
             ::get_token<char_const*>(this_02,&local_70,end);
    if (cVar17 == token_group_end) {
      *begin = local_70;
      goto LAB_0012b40d;
    }
    goto LAB_0012bb87;
  case token_positive_lookahead:
    goto switchD_0012b3dc_caseD_15;
  case token_negative_lookahead:
    bVar6 = true;
    bVar7 = false;
    goto LAB_0012b57b;
  case token_positive_lookbehind:
    bVar7 = true;
    bVar6 = false;
    goto LAB_0012bb8c;
  case token_negative_lookbehind:
    bVar7 = true;
    bVar6 = false;
LAB_0012b57b:
    local_130 = CONCAT44(local_130._4_4_,
                         (int)CONCAT71((int7)((ulong)((long)&switchD_0012b3dc::switchdataD_0016b268
                                                     + (long)(int)(&switchD_0012b3dc::
                                                                    switchdataD_0016b268)
                                                                  [cVar17 - token_no_mark]) >> 8),1)
                        );
LAB_0012bb94:
    bVar8 = false;
LAB_0012bb96:
    parse_alternates<char_const*>
              ((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_178,
               (regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
                *)local_168._48_8_,begin,end);
    detail::
    sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator+=(&local_128,
                 (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_178);
    if ((dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_168._24_8_ !=
        (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      LOCK();
      pcVar3 = &((matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_168._24_8_)->
                super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ;
      (pcVar3->count_).value_ = (pcVar3->count_).value_ + -1;
      UNLOCK();
      if ((pcVar3->count_).value_ == 0) {
        (*(((matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_168._24_8_)->
          super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._vptr_matchable[1])();
      }
    }
    if ((error_info_container *)local_168._8_8_ != (error_info_container *)0x0) {
      LOCK();
      peVar1 = (error_info_container *)(local_168._8_8_ + 8);
      *(int *)peVar1 = *(int *)peVar1 + -1;
      UNLOCK();
      if (*(int *)peVar1 == 0) {
        (**(code **)(*(long *)local_168._8_8_ + 8))();
      }
    }
    detail::
    sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator+=(&local_128,
                 (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d0);
    if ((*begin == end) ||
       (cVar17 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                 ::get_token<char_const*>(this_02,begin,end), cVar17 != token_group_end)) {
      std::runtime_error::runtime_error((runtime_error *)local_178,"mismatched parenthesis");
      local_168._8_8_ = (error_info_container *)0x0;
      local_178 = (undefined1  [8])&PTR__regex_error_00195328;
      local_168._0_8_ = &PTR__regex_error_00195350;
      local_168._40_4_ = error_paren;
      local_168._16_8_ =
           "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_group(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
      ;
      local_168._24_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
      ;
      local_168._32_8_ = (_Base_ptr)0xffffffff000001b7;
      throw_exception<boost::xpressive::regex_error>((regex_error *)local_178);
    }
    if (bVar6) {
      detail::
      make_independent_end_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_178,(detail *)(ulong)local_128.pure_,pure);
      detail::
      sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator+=(&local_128,
                   (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_178);
      if ((dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_168._24_8_ !=
          (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        LOCK();
        pcVar3 = &((matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_168._24_8_)->
                  super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ;
        (pcVar3->count_).value_ = (pcVar3->count_).value_ + -1;
        UNLOCK();
        if ((pcVar3->count_).value_ == 0) {
          (*(((matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_168._24_8_)->
            super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._vptr_matchable[1])();
        }
      }
      if ((error_info_container *)local_168._8_8_ != (error_info_container *)0x0) {
        LOCK();
        peVar1 = (error_info_container *)(local_168._8_8_ + 8);
        *(int *)peVar1 = *(int *)peVar1 + -1;
        UNLOCK();
        if (*(int *)peVar1 == 0) {
          (**(code **)(*(long *)local_168._8_8_ + 8))();
        }
      }
      local_178 = (undefined1  [8])local_128.head_.xpr_.px;
      if (local_128.head_.xpr_.px !=
          (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        LOCK();
        (((_Rb_tree_header *)((long)local_128.head_.xpr_.px + 8))->_M_header)._M_color =
             (((_Rb_tree_header *)((long)local_128.head_.xpr_.px + 8))->_M_header)._M_color +
             _S_black;
        UNLOCK();
      }
      local_170._1_1_ = local_128.pure_;
      local_170._0_1_ = (char)local_130;
      mVar22.px = (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)operator_new(0x28);
      detail::
      dynamic_xpression<boost::xpressive::detail::lookahead_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::dynamic_xpression((dynamic_xpression<boost::xpressive::detail::lookahead_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)mVar22.px,
                          (lookahead_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_178);
      LOCK();
      p_Var2 = &(((element_type *)mVar22.px)->
                super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ).refs_._M_t._M_impl.super__Rb_tree_header;
      (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color + _S_black;
      UNLOCK();
      LOCK();
      p_Var2 = &(((element_type *)mVar22.px)->
                super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ).refs_._M_t._M_impl.super__Rb_tree_header;
      (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color + _S_black;
      UNLOCK();
      LOCK();
      p_Var2 = &(((element_type *)mVar22.px)->
                super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ).refs_._M_t._M_impl.super__Rb_tree_header;
      (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color + _S_black;
      UNLOCK();
      LOCK();
      p_Var2 = &(((element_type *)mVar22.px)->
                super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ).refs_._M_t._M_impl.super__Rb_tree_header;
      (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color - _S_black;
      UNLOCK();
      if ((p_Var2->_M_header)._M_color == _S_red) {
        (**(code **)(*(long *)&(((element_type *)mVar22.px)->
                               super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ).refs_._M_t._M_impl + 8))(mVar22.px);
      }
      LOCK();
      p_Var2 = &(((element_type *)mVar22.px)->
                super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ).refs_._M_t._M_impl.super__Rb_tree_header;
      (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color - _S_black;
      UNLOCK();
      if ((p_Var2->_M_header)._M_color == _S_red) {
        (**(code **)(*(long *)&(((element_type *)mVar22.px)->
                               super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ).refs_._M_t._M_impl + 8))(mVar22.px);
      }
      peVar20 = (element_type *)
                &(((element_type *)mVar22.px)->
                 super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ).refs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
LAB_0012bda3:
      uVar9 = local_e8._0_4_;
      local_128._4_4_ = local_e8._3_4_;
      local_128.width_.value_ = 0;
      local_128.quant_ = quant_none;
LAB_0012bdcf:
      local_128._0_4_ = uVar9 << 8;
      if (local_128.head_.xpr_.px !=
          (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        LOCK();
        p_Var2 = (_Rb_tree_header *)((long)local_128.head_.xpr_.px + 8);
        (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color - _S_black;
        UNLOCK();
        if ((p_Var2->_M_header)._M_color == _S_red) {
          peVar10 = (enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_128.head_.xpr_.px;
          local_128.head_.xpr_.px = (matchable_ptr)(matchable_ptr)mVar22.px;
          (**(code **)(*(long *)&(peVar10->refs_)._M_t._M_impl + 8))();
          mVar22 = local_128.head_.xpr_.px;
        }
      }
      local_128.head_.xpr_.px = (matchable_ptr)(matchable_ptr)mVar22.px;
      iVar14.px = local_128.alt_end_xpr_.px;
      local_128.alt_end_xpr_.px =
           (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0;
      local_128.tail_ =
           (shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)peVar20;
      if (iVar14.px !=
          (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        LOCK();
        pcVar3 = (counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)iVar14.px + 8);
        (pcVar3->count_).value_ = (pcVar3->count_).value_ + -1;
        UNLOCK();
        if ((pcVar3->count_).value_ == 0) {
          (*((iVar14.px)->
            super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._vptr_matchable[1])();
        }
      }
      local_128.alternates_ =
           (alternates_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0;
      if (local_178 != (undefined1  [8])0x0) {
        LOCK();
        p_Var2 = (_Rb_tree_header *)((long)local_178 + 8);
        (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color - _S_black;
        UNLOCK();
        if ((p_Var2->_M_header)._M_color == _S_red) {
          (**(code **)(*(long *)local_178 + 8))();
        }
      }
    }
    else {
      if (bVar7) {
        detail::
        make_independent_end_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_178,(detail *)(ulong)local_128.pure_,pure);
        detail::
        sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator+=(&local_128,
                     (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_178);
        if ((dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_168._24_8_ !=
            (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x0) {
          LOCK();
          pcVar3 = &((matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_168._24_8_)->
                    super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ;
          (pcVar3->count_).value_ = (pcVar3->count_).value_ + -1;
          UNLOCK();
          if ((pcVar3->count_).value_ == 0) {
            (*(((matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_168._24_8_)->
              super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_matchable[1])();
          }
        }
        if ((error_info_container *)local_168._8_8_ != (error_info_container *)0x0) {
          LOCK();
          peVar1 = (error_info_container *)(local_168._8_8_ + 8);
          *(int *)peVar1 = *(int *)peVar1 + -1;
          UNLOCK();
          if (*(int *)peVar1 == 0) {
            (**(code **)(*(long *)local_168._8_8_ + 8))();
          }
        }
        detail::
        lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::lookbehind_matcher
                  ((lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_178,&local_128.head_,local_128.width_.value_,local_130._0_1_,
                   local_128.pure_);
        mVar22.px = (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)operator_new(0x30);
        detail::
        dynamic_xpression<boost::xpressive::detail::lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::dynamic_xpression((dynamic_xpression<boost::xpressive::detail::lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)mVar22.px,
                            (lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_178);
        LOCK();
        p_Var2 = &(((element_type *)mVar22.px)->
                  super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ).refs_._M_t._M_impl.super__Rb_tree_header;
        (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color + _S_black;
        UNLOCK();
        LOCK();
        p_Var2 = &(((element_type *)mVar22.px)->
                  super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ).refs_._M_t._M_impl.super__Rb_tree_header;
        (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color + _S_black;
        UNLOCK();
        LOCK();
        p_Var2 = &(((element_type *)mVar22.px)->
                  super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ).refs_._M_t._M_impl.super__Rb_tree_header;
        (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color + _S_black;
        UNLOCK();
        LOCK();
        p_Var2 = &(((element_type *)mVar22.px)->
                  super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ).refs_._M_t._M_impl.super__Rb_tree_header;
        (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color - _S_black;
        UNLOCK();
        if ((p_Var2->_M_header)._M_color == _S_red) {
          (**(code **)(*(long *)&(((element_type *)mVar22.px)->
                                 super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ).refs_._M_t._M_impl + 8))(mVar22.px);
        }
        LOCK();
        p_Var2 = &(((element_type *)mVar22.px)->
                  super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ).refs_._M_t._M_impl.super__Rb_tree_header;
        (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color - _S_black;
        UNLOCK();
        if ((p_Var2->_M_header)._M_color == _S_red) {
          (**(code **)(*(long *)&(((element_type *)mVar22.px)->
                                 super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ).refs_._M_t._M_impl + 8))(mVar22.px);
        }
        peVar20 = (element_type *)
                  &(((element_type *)mVar22.px)->
                   super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ).refs_._M_t._M_impl.super__Rb_tree_header._M_node_count;
        goto LAB_0012bda3;
      }
      if (bVar8) {
        detail::
        make_independent_end_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_178,(detail *)(ulong)local_128.pure_,pure);
        detail::
        sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator+=(&local_128,
                     (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_178);
        if ((dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_168._24_8_ !=
            (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x0) {
          LOCK();
          pcVar3 = &((matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_168._24_8_)->
                    super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ;
          (pcVar3->count_).value_ = (pcVar3->count_).value_ + -1;
          UNLOCK();
          if ((pcVar3->count_).value_ == 0) {
            (*(((matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_168._24_8_)->
              super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_matchable[1])();
          }
        }
        if ((error_info_container *)local_168._8_8_ != (error_info_container *)0x0) {
          LOCK();
          peVar1 = (error_info_container *)(local_168._8_8_ + 8);
          *(int *)peVar1 = *(int *)peVar1 + -1;
          UNLOCK();
          if (*(int *)peVar1 == 0) {
            (**(code **)(*(long *)local_168._8_8_ + 8))();
          }
        }
        local_178 = (undefined1  [8])local_128.head_.xpr_.px;
        if (local_128.head_.xpr_.px !=
            (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x0) {
          LOCK();
          (((_Rb_tree_header *)((long)local_128.head_.xpr_.px + 8))->_M_header)._M_color =
               (((_Rb_tree_header *)((long)local_128.head_.xpr_.px + 8))->_M_header)._M_color +
               _S_black;
          UNLOCK();
        }
        local_170._0_1_ = local_128.pure_;
        mVar22.px = (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)operator_new(0x28);
        detail::
        dynamic_xpression<boost::xpressive::detail::keeper_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::dynamic_xpression((dynamic_xpression<boost::xpressive::detail::keeper_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)mVar22.px,
                            (keeper_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_178);
        LOCK();
        p_Var2 = &(((element_type *)mVar22.px)->
                  super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ).refs_._M_t._M_impl.super__Rb_tree_header;
        (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color + _S_black;
        UNLOCK();
        LOCK();
        p_Var2 = &(((element_type *)mVar22.px)->
                  super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ).refs_._M_t._M_impl.super__Rb_tree_header;
        (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color + _S_black;
        UNLOCK();
        LOCK();
        p_Var2 = &(((element_type *)mVar22.px)->
                  super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ).refs_._M_t._M_impl.super__Rb_tree_header;
        (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color + _S_black;
        UNLOCK();
        LOCK();
        p_Var2 = &(((element_type *)mVar22.px)->
                  super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ).refs_._M_t._M_impl.super__Rb_tree_header;
        (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color - _S_black;
        UNLOCK();
        if ((p_Var2->_M_header)._M_color == _S_red) {
          (**(code **)(*(long *)&(((element_type *)mVar22.px)->
                                 super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ).refs_._M_t._M_impl + 8))(mVar22.px);
        }
        LOCK();
        p_Var2 = &(((element_type *)mVar22.px)->
                  super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ).refs_._M_t._M_impl.super__Rb_tree_header;
        (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color - _S_black;
        UNLOCK();
        if ((p_Var2->_M_header)._M_color == _S_red) {
          (**(code **)(*(long *)&(((element_type *)mVar22.px)->
                                 super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ).refs_._M_t._M_impl + 8))(mVar22.px);
        }
        peVar20 = (element_type *)
                  &(((element_type *)mVar22.px)->
                   super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ).refs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        uVar25 = local_e8._0_4_;
        local_128._4_4_ = local_e8._3_4_;
        uVar9 = uVar25 & 0xffffff;
        local_128.width_.value_ = 0x3ffffffe;
        local_128.quant_ = quant_variable_width;
        goto LAB_0012bdcf;
      }
    }
    iVar14.px = local_128.alt_end_xpr_.px;
    sVar13.xpr_.px = local_128.head_.xpr_.px;
    *(undefined4 *)(local_168._48_8_ + 0x220) = local_94;
    *(quant_enum *)
     &local_f0.px[1].
      super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._vptr_matchable = local_128.quant_;
    ((local_f0.px)->
    super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._vptr_matchable = (_func_int **)CONCAT44(local_128._4_4_,local_128._0_4_);
    ((width *)
    &(local_f0.px)->
     super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )->value_ = local_128.width_.value_;
    local_128.head_.xpr_.px =
         (matchable_ptr)
         (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    (((shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)&local_f0.px[1].
          super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     )->xpr_).px = (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)sVar13.xpr_.px;
    local_f0.px[2].
    super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._vptr_matchable = (_func_int **)local_128.tail_;
    local_128.alt_end_xpr_.px =
         (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    ((intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      *)&local_f0.px[2].
         super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    )->px = iVar14.px;
    local_f0.px[3].
    super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._vptr_matchable = (_func_int **)local_128.alternates_;
    break;
  case token_independent_sub_expression:
    bVar8 = true;
    bVar6 = false;
    bVar7 = false;
    local_130 = (ulong)local_130._4_4_ << 0x20;
    goto LAB_0012bb96;
  case token_comment:
    do {
      while( true ) {
        if (*begin == end) {
          std::runtime_error::runtime_error((runtime_error *)local_178,"mismatched parenthesis");
          local_168._8_8_ = (error_info_container *)0x0;
          local_178 = (undefined1  [8])&PTR__regex_error_00195328;
          local_168._0_8_ = &PTR__regex_error_00195350;
          local_168._40_4_ = error_paren;
          local_168._16_8_ =
               "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_group(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
          ;
          local_168._24_8_ =
               "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
          ;
          local_168._32_8_ = (_Base_ptr)0xffffffff00000158;
          throw_exception<boost::xpressive::regex_error>((regex_error *)local_178);
        }
        cVar17 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                 ::get_token<char_const*>(this_02,begin,end);
        if (cVar17 != token_literal) break;
LAB_0012b45c:
        *begin = *begin + 1;
      }
      if (cVar17 == token_escape) {
        if (*begin == end) {
          std::runtime_error::runtime_error((runtime_error *)local_178,"incomplete escape sequence")
          ;
          local_168._8_8_ = (error_info_container *)0x0;
          local_178 = (undefined1  [8])&PTR__regex_error_00195328;
          local_168._0_8_ = &PTR__regex_error_00195350;
          local_168._40_4_ = error_escape;
          local_168._16_8_ =
               "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_group(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
          ;
          local_168._24_8_ =
               "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
          ;
          local_168._32_8_ = (_Base_ptr)0xffffffff0000015f;
          throw_exception<boost::xpressive::regex_error>((regex_error *)local_178);
        }
        goto LAB_0012b45c;
      }
    } while (cVar17 != token_group_end);
LAB_0012b40d:
    parse_atom<char_const*>
              ((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_f0.px,
               (regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
                *)local_168._48_8_,begin,end);
    break;
  case token_recurse:
    if ((*begin == end) ||
       (cVar17 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                 ::get_token<char_const*>(this_02,begin,end), cVar17 != token_group_end)) {
      std::runtime_error::runtime_error((runtime_error *)local_178,"mismatched parenthesis");
      local_168._8_8_ = (error_info_container *)0x0;
      local_178 = (undefined1  [8])&PTR__regex_error_00195328;
      local_168._0_8_ = &PTR__regex_error_00195350;
      local_168._40_4_ = error_paren;
      local_168._16_8_ =
           "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_group(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
      ;
      local_168._24_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
      ;
      local_168._32_8_ = (_Base_ptr)0xffffffff00000170;
      throw_exception<boost::xpressive::regex_error>((regex_error *)local_178);
    }
    local_178 = *(undefined1 (*) [8])(local_168._48_8_ + 0x230);
    local_170 = *(sp_counted_base **)(local_168._48_8_ + 0x238);
    if (local_170 != (sp_counted_base *)0x0) {
      LOCK();
      local_170->weak_count_ = local_170->weak_count_ + 1;
      UNLOCK();
    }
    local_168._0_8_ = *(undefined8 *)(local_168._48_8_ + 0x230);
    peVar20 = (element_type *)operator_new(0x30);
    detail::
    dynamic_xpression<boost::xpressive::detail::regex_byref_matcher<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::dynamic_xpression((dynamic_xpression<boost::xpressive::detail::regex_byref_matcher<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)peVar20,
                        (regex_byref_matcher<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_178);
    LOCK();
    p_Var2 = &(peVar20->
              super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ).refs_._M_t._M_impl.super__Rb_tree_header;
    (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color + _S_black;
    UNLOCK();
    local_e8._0_8_ = peVar20;
    detail::sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
    sequence<boost::xpressive::detail::regex_byref_matcher<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
              ((sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
               local_f0.px,
               (intrusive_ptr<boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::regex_byref_matcher<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_e8);
    if ((element_type *)local_e8._0_8_ != (element_type *)0x0) {
      LOCK();
      p_Var2 = (_Rb_tree_header *)
               (&(((enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_e8._0_8_)->refs_)._M_t._M_impl.field_0x0 + 8);
      (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color - _S_black;
      UNLOCK();
      if ((p_Var2->_M_header)._M_color == _S_red) {
        (**(code **)(*(long *)&(((enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_e8._0_8_)->refs_)._M_t._M_impl + 8))();
      }
    }
    boost::detail::weak_count::~weak_count((weak_count *)&local_170);
    break;
  case token_rule_assign:
    std::runtime_error::runtime_error
              ((runtime_error *)local_178,"rule assignments must be at the front of the regex");
    local_168._8_8_ = (error_info_container *)0x0;
    local_168._16_8_ = (_Base_ptr)0x0;
    local_168._24_8_ =
         (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    local_168._32_8_ = (_Base_ptr)0xffffffffffffffff;
    local_178 = (undefined1  [8])&PTR__regex_error_00195328;
    local_168._0_8_ = &PTR__regex_error_00195350;
    local_168._40_4_ = error_badrule;
    local_e8._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
    ;
    local_e8._8_8_ =
         "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_group(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
    ;
    local_e8._16_8_ = (pointer)0x176;
    throw_exception<boost::xpressive::regex_error>
              ((regex_error *)local_178,(source_location *)local_e8);
  case token_rule_ref:
    if ((*begin == end) ||
       (cVar17 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                 ::get_token<char_const*>(this_02,begin,end), cVar17 != token_group_end)) {
      std::runtime_error::runtime_error((runtime_error *)local_178,"mismatched parenthesis");
      local_168._8_8_ = (error_info_container *)0x0;
      local_178 = (undefined1  [8])&PTR__regex_error_00195328;
      local_168._0_8_ = &PTR__regex_error_00195350;
      local_168._40_4_ = error_paren;
      local_168._16_8_ =
           "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_group(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
      ;
      local_168._24_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
      ;
      local_168._32_8_ = (_Base_ptr)0xffffffff00000181;
      throw_exception<boost::xpressive::regex_error>((regex_error *)local_178);
    }
    this_00 = (tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::xpressive::basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::xpressive::basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::xpressive::basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::xpressive::basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                               *)(local_168._48_8_ + 0x240),&local_90);
    psVar19 = detail::
              tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::get(this_00);
    local_e8._0_8_ = psVar19->px;
    local_e8._8_8_ = (psVar19->pn).pi_;
    if ((sp_counted_base *)local_e8._8_8_ != (sp_counted_base *)0x0) {
      LOCK();
      ((sp_counted_base *)local_e8._8_8_)->use_count_ =
           ((sp_counted_base *)local_e8._8_8_)->use_count_ + 1;
      UNLOCK();
    }
    detail::
    enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::track_reference(*(enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        **)(local_168._48_8_ + 0x230),
                      (enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_e8._0_8_);
    local_178 = (undefined1  [8])local_e8._0_8_;
    local_170 = (sp_counted_base *)local_e8._8_8_;
    if ((sp_counted_base *)local_e8._8_8_ != (sp_counted_base *)0x0) {
      LOCK();
      *(uint_least32_t *)(local_e8._8_8_ + 0xc) = *(uint_least32_t *)(local_e8._8_8_ + 0xc) + 1;
      UNLOCK();
    }
    local_168._0_8_ = local_e8._0_8_;
    this_01 = (dynamic_xpression<boost::xpressive::detail::regex_byref_matcher<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)operator_new(0x30);
    detail::
    dynamic_xpression<boost::xpressive::detail::regex_byref_matcher<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::dynamic_xpression(this_01,(regex_byref_matcher<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_178);
    LOCK();
    pcVar3 = &(this_01->
              super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).
              super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ;
    (pcVar3->count_).value_ = (pcVar3->count_).value_ + 1;
    UNLOCK();
    local_68.px = this_01;
    detail::sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
    sequence<boost::xpressive::detail::regex_byref_matcher<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
              ((sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *)
               local_f0.px,&local_68);
    if (local_68.px !=
        (dynamic_xpression<boost::xpressive::detail::regex_byref_matcher<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      LOCK();
      pcVar3 = &((local_68.px)->
                super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ;
      (pcVar3->count_).value_ = (pcVar3->count_).value_ + -1;
      UNLOCK();
      if ((pcVar3->count_).value_ == 0) {
        (*((local_68.px)->
          super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).
          super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._vptr_matchable[1])();
      }
    }
    boost::detail::weak_count::~weak_count((weak_count *)&local_170);
    boost::detail::shared_count::~shared_count((shared_count *)(local_e8 + 8));
    break;
  case token_named_mark:
    local_60 = *(long *)local_168._48_8_ + 1;
    *(long *)local_168._48_8_ = local_60;
    local_130 = *(ulong *)(local_168._48_8_ + 0x230);
    lVar21 = *(long *)(local_130 + 0x98) - *(long *)(local_130 + 0x90);
    local_58 = this_02;
    if (lVar21 != 0) {
      lVar21 = (lVar21 >> 3) * -0x3333333333333333;
      lVar21 = lVar21 + (ulong)(lVar21 == 0);
      psVar27 = (size_t *)(*(long *)(local_130 + 0x90) + 8);
      do {
        sVar4 = *psVar27;
        if ((sVar4 == sVar16) &&
           ((sVar4 == 0 || (iVar18 = bcmp((void *)psVar27[-1],_Var15._M_p,sVar4), iVar18 == 0)))) {
          std::runtime_error::runtime_error((runtime_error *)local_178,"named mark already exists");
          local_168._8_8_ = (error_info_container *)0x0;
          local_178 = (undefined1  [8])&PTR__regex_error_00195328;
          local_168._0_8_ = &PTR__regex_error_00195350;
          local_168._40_4_ = error_badmark;
          local_168._16_8_ =
               "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_group(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
          ;
          local_168._24_8_ =
               "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
          ;
          local_168._32_8_ = (_Base_ptr)0xffffffff0000018c;
          throw_exception<boost::xpressive::regex_error>((regex_error *)local_178);
        }
        psVar27 = psVar27 + 5;
        lVar21 = lVar21 + -1;
      } while (lVar21 != 0);
    }
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_90._M_dataplus._M_p,
               local_90._M_dataplus._M_p + local_90._M_string_length);
    p_Var5 = *(_Base_ptr *)local_168._48_8_;
    local_178 = (undefined1  [8])local_168;
    std::__cxx11::string::_M_construct<char*>((string *)local_178,local_50,local_50 + local_48);
    local_168._16_8_ = p_Var5;
    std::
    vector<boost::xpressive::detail::named_mark<char>,std::allocator<boost::xpressive::detail::named_mark<char>>>
    ::emplace_back<boost::xpressive::detail::named_mark<char>>
              ((vector<boost::xpressive::detail::named_mark<char>,std::allocator<boost::xpressive::detail::named_mark<char>>>
                *)(local_130 + 0x90),(named_mark<char> *)local_178);
    if (local_178 != (undefined1  [8])local_168) {
      operator_delete((void *)local_178);
    }
    this_02 = local_58;
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    mVar22.px = (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)operator_new(0x18);
    uVar25 = (undefined4)local_60;
    *(undefined4 *)&(mVar22.px)->field_0xc = uVar25;
    (((_Rb_tree_header *)
     &(mVar22.px)->
      super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     )->_M_header)._M_color = _S_red;
    *(undefined ***)
     &(((enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&(mVar22.px)->
            super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )->refs_)._M_t._M_impl = &PTR__dynamic_xpression_00195838;
    psVar23 = detail::
              get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ();
    p_Var5 = (_Base_ptr)(psVar23->xpr_).px;
    mVar22.px[1].
    super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._vptr_matchable = (_func_int **)p_Var5;
    if (p_Var5 != (_Base_ptr)0x0) {
      LOCK();
      *(int *)&p_Var5->_M_parent = *(int *)&p_Var5->_M_parent + 1;
      UNLOCK();
    }
    LOCK();
    (((_Rb_tree_header *)
     &(mVar22.px)->
      super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     )->_M_header)._M_color =
         (((_Rb_tree_header *)
          &(mVar22.px)->
           super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )->_M_header)._M_color + _S_black;
    UNLOCK();
    LOCK();
    (((_Rb_tree_header *)
     &(mVar22.px)->
      super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     )->_M_header)._M_color =
         (((_Rb_tree_header *)
          &(mVar22.px)->
           super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )->_M_header)._M_color + _S_black;
    UNLOCK();
    LOCK();
    (((_Rb_tree_header *)
     &(mVar22.px)->
      super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     )->_M_header)._M_color =
         (((_Rb_tree_header *)
          &(mVar22.px)->
           super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )->_M_header)._M_color + _S_black;
    UNLOCK();
    LOCK();
    p_Var2 = (_Rb_tree_header *)
             &(mVar22.px)->
              super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ;
    (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color - _S_black;
    UNLOCK();
    if ((p_Var2->_M_header)._M_color == _S_red) {
      (**(code **)(*(long *)&(((enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&(mVar22.px)->
                                   super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )->refs_)._M_t._M_impl + 8))(mVar22.px);
    }
    LOCK();
    p_Var2 = (_Rb_tree_header *)
             &(mVar22.px)->
              super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ;
    (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color - _S_black;
    UNLOCK();
    if ((p_Var2->_M_header)._M_color == _S_red) {
      (**(code **)(*(long *)&(((enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&(mVar22.px)->
                                   super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )->refs_)._M_t._M_impl + 8))(mVar22.px);
    }
    peVar20 = (element_type *)(mVar22.px + 1);
    uVar12 = local_178._0_4_;
    local_128._0_4_ = uVar12 << 8;
    local_128._4_4_ = local_178._3_4_;
    local_128.width_.value_ = 0;
    local_128.quant_ = quant_fixed_width;
    if (local_128.head_.xpr_.px !=
        (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      LOCK();
      p_Var2 = (_Rb_tree_header *)((long)local_128.head_.xpr_.px + 8);
      (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color - _S_black;
      UNLOCK();
      if ((p_Var2->_M_header)._M_color == _S_red) {
        peVar10 = (enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_128.head_.xpr_.px;
        local_128.head_.xpr_.px = (matchable_ptr)(matchable_ptr)mVar22.px;
        (**(code **)(*(long *)&(peVar10->refs_)._M_t._M_impl + 8))();
        mVar22 = local_128.head_.xpr_.px;
      }
    }
    local_128.head_.xpr_.px = (matchable_ptr)(matchable_ptr)mVar22.px;
    iVar14.px = local_128.alt_end_xpr_.px;
    local_128.alt_end_xpr_.px =
         (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    local_128.tail_ =
         (shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)peVar20;
    if (iVar14.px !=
        (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      LOCK();
      pcVar3 = (counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)iVar14.px + 8);
      (pcVar3->count_).value_ = (pcVar3->count_).value_ + -1;
      UNLOCK();
      if ((pcVar3->count_).value_ == 0) {
        (*((iVar14.px)->
          super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).
          super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._vptr_matchable[1])();
      }
    }
    local_128.alternates_ =
         (alternates_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    mVar22.px = (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)operator_new(0x18);
    *(undefined4 *)&(mVar22.px)->field_0xc = uVar25;
    ((mVar22.px)->
    super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).count_.value_ = 0;
    ((mVar22.px)->
    super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._vptr_matchable = (_func_int **)&PTR__dynamic_xpression_001958d8;
    psVar23 = detail::
              get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ();
    goto LAB_0012bab9;
  case token_named_mark_ref:
    if ((*begin == end) ||
       (cVar17 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                 ::get_token<char_const*>(this_02,begin,end), sVar16 = local_90._M_string_length,
       _Var15._M_p = local_90._M_dataplus._M_p, cVar17 != token_group_end)) {
      std::runtime_error::runtime_error((runtime_error *)local_178,"mismatched parenthesis");
      local_168._8_8_ = (error_info_container *)0x0;
      local_178 = (undefined1  [8])&PTR__regex_error_00195328;
      local_168._0_8_ = &PTR__regex_error_00195350;
      local_168._40_4_ = error_paren;
      local_168._16_8_ =
           "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_group(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
      ;
      local_168._24_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
      ;
      local_168._32_8_ = (_Base_ptr)0xffffffff00000199;
      throw_exception<boost::xpressive::regex_error>((regex_error *)local_178);
    }
    puVar26 = *(undefined8 **)(*(long *)(local_168._48_8_ + 0x230) + 0x90);
    lVar21 = *(long *)(*(long *)(local_168._48_8_ + 0x230) + 0x98) - (long)puVar26;
    if (lVar21 != 0) {
      lVar21 = (lVar21 >> 3) * -0x3333333333333333;
      lVar21 = lVar21 + (ulong)(lVar21 == 0);
      do {
        sVar4 = puVar26[1];
        if ((sVar4 == sVar16) &&
           ((sVar4 == 0 || (iVar18 = bcmp((void *)*puVar26,_Var15._M_p,sVar4), iVar18 == 0)))) {
          detail::
          make_backref_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                    ((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_f0.px,(detail *)(ulong)*(uint *)(puVar26 + 4),
                     *(int *)(local_168._48_8_ + 0x220),(syntax_option_type)this_02,in_R8);
          goto LAB_0012bf72;
        }
        puVar26 = puVar26 + 5;
        lVar21 = lVar21 + -1;
      } while (lVar21 != 0);
    }
    std::runtime_error::runtime_error((runtime_error *)local_178,"invalid named back-reference");
    local_168._8_8_ = (error_info_container *)0x0;
    local_168._16_8_ = (_Base_ptr)0x0;
    local_168._24_8_ =
         (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    local_168._32_8_ = (_Base_ptr)0xffffffffffffffff;
    local_178 = (undefined1  [8])&PTR__regex_error_00195328;
    local_168._0_8_ = &PTR__regex_error_00195350;
    local_168._40_4_ = error_badmark;
    local_e8._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
    ;
    local_e8._8_8_ =
         "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_group(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
    ;
    local_e8._16_8_ = (pointer)0x1a5;
    throw_exception<boost::xpressive::regex_error>
              ((regex_error *)local_178,(source_location *)local_e8);
  }
LAB_0012bf72:
  if (local_a8.px !=
      (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    LOCK();
    pcVar3 = &((local_a8.px)->
              super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).
              super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ;
    (pcVar3->count_).value_ = (pcVar3->count_).value_ + -1;
    UNLOCK();
    if ((pcVar3->count_).value_ == 0) {
      (*((local_a8.px)->
        super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).
        super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._vptr_matchable[1])();
    }
  }
  if (local_b8.px !=
      (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    LOCK();
    pcVar3 = &(local_b8.px)->
              super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ;
    (pcVar3->count_).value_ = (pcVar3->count_).value_ + -1;
    UNLOCK();
    if ((pcVar3->count_).value_ == 0) {
      (*((local_b8.px)->
        super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._vptr_matchable[1])();
    }
  }
  if (local_128.alt_end_xpr_.px !=
      (dynamic_xpression<boost::xpressive::detail::alternate_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    LOCK();
    pcVar3 = (counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)local_128.alt_end_xpr_.px + 8);
    (pcVar3->count_).value_ = (pcVar3->count_).value_ + -1;
    UNLOCK();
    if ((pcVar3->count_).value_ == 0) {
      (*((local_128.alt_end_xpr_.px)->
        super_matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).
        super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._vptr_matchable[1])();
    }
  }
  if (local_128.head_.xpr_.px !=
      (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    LOCK();
    p_Var2 = (_Rb_tree_header *)((long)local_128.head_.xpr_.px + 8);
    (p_Var2->_M_header)._M_color = (p_Var2->_M_header)._M_color - _S_black;
    UNLOCK();
    if ((p_Var2->_M_header)._M_color == _S_red) {
      (**(code **)(*(long *)&(((enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_128.head_.xpr_.px)->refs_)._M_t._M_impl + 8))();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_f0.px;
}

Assistant:

detail::sequence<BidiIter> parse_group(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        int mark_nbr = 0;
        bool keeper = false;
        bool lookahead = false;
        bool lookbehind = false;
        bool negative = false;
        string_type name;

        detail::sequence<BidiIter> seq, seq_end;
        FwdIter tmp = FwdIter();

        syntax_option_type old_flags = this->traits_.flags();

        switch(this->traits_.get_group_type(begin, end, name))
        {
        case token_no_mark:
            // Don't process empty groups like (?:) or (?i)
            // BUGBUG this doesn't handle the degenerate (?:)+ correctly
            if(token_group_end == this->traits_.get_token(tmp = begin, end))
            {
                return this->parse_atom(begin = tmp, end);
            }
            break;

        case token_negative_lookahead:
            negative = true;
            BOOST_FALLTHROUGH;
        case token_positive_lookahead:
            lookahead = true;
            break;

        case token_negative_lookbehind:
            negative = true;
            BOOST_FALLTHROUGH;
        case token_positive_lookbehind:
            lookbehind = true;
            break;

        case token_independent_sub_expression:
            keeper = true;
            break;

        case token_comment:
            while(BOOST_XPR_ENSURE_(begin != end, error_paren, "mismatched parenthesis"))
            {
                switch(this->traits_.get_token(begin, end))
                {
                case token_group_end:
                    return this->parse_atom(begin, end);
                case token_escape:
                    BOOST_XPR_ENSURE_(begin != end, error_escape, "incomplete escape sequence");
                    BOOST_FALLTHROUGH;
                case token_literal:
                    ++begin;
                    break;
                default:
                    break;
                }
            }
            break;

        case token_recurse:
            BOOST_XPR_ENSURE_
            (
                begin != end && token_group_end == this->traits_.get_token(begin, end)
              , error_paren
              , "mismatched parenthesis"
            );
            return detail::make_dynamic<BidiIter>(detail::regex_byref_matcher<BidiIter>(this->self_));

        case token_rule_assign:
            BOOST_THROW_EXCEPTION(
                regex_error(error_badrule, "rule assignments must be at the front of the regex")
            );
            break;

        case token_rule_ref:
            {
                typedef detail::core_access<BidiIter> access;
                BOOST_XPR_ENSURE_
                (
                    begin != end && token_group_end == this->traits_.get_token(begin, end)
                  , error_paren
                  , "mismatched parenthesis"
                );
                basic_regex<BidiIter> &rex = this->rules_[name];
                shared_ptr<detail::regex_impl<BidiIter> > impl = access::get_regex_impl(rex);
                this->self_->track_reference(*impl);
                return detail::make_dynamic<BidiIter>(detail::regex_byref_matcher<BidiIter>(impl));
            }

        case token_named_mark:
            mark_nbr = static_cast<int>(++this->mark_count_);
            for(std::size_t i = 0; i < this->self_->named_marks_.size(); ++i)
            {
                BOOST_XPR_ENSURE_(this->self_->named_marks_[i].name_ != name, error_badmark, "named mark already exists");
            }
            this->self_->named_marks_.push_back(detail::named_mark<char_type>(name, this->mark_count_));
            seq = detail::make_dynamic<BidiIter>(detail::mark_begin_matcher(mark_nbr));
            seq_end = detail::make_dynamic<BidiIter>(detail::mark_end_matcher(mark_nbr));
            break;

        case token_named_mark_ref:
            BOOST_XPR_ENSURE_
            (
                begin != end && token_group_end == this->traits_.get_token(begin, end)
              , error_paren
              , "mismatched parenthesis"
            );
            for(std::size_t i = 0; i < this->self_->named_marks_.size(); ++i)
            {
                if(this->self_->named_marks_[i].name_ == name)
                {
                    mark_nbr = static_cast<int>(this->self_->named_marks_[i].mark_nbr_);
                    return detail::make_backref_xpression<BidiIter>
                    (
                        mark_nbr, this->traits_.flags(), this->rxtraits()
                    );
                }
            }
            BOOST_THROW_EXCEPTION(regex_error(error_badmark, "invalid named back-reference"));
            break;

        default:
            mark_nbr = static_cast<int>(++this->mark_count_);
            seq = detail::make_dynamic<BidiIter>(detail::mark_begin_matcher(mark_nbr));
            seq_end = detail::make_dynamic<BidiIter>(detail::mark_end_matcher(mark_nbr));
            break;
        }

        // alternates
        seq += this->parse_alternates(begin, end);
        seq += seq_end;
        BOOST_XPR_ENSURE_
        (
            begin != end && token_group_end == this->traits_.get_token(begin, end)
          , error_paren
          , "mismatched parenthesis"
        );

        typedef detail::shared_matchable<BidiIter> xpr_type;
        if(lookahead)
        {
            seq += detail::make_independent_end_xpression<BidiIter>(seq.pure());
            detail::lookahead_matcher<xpr_type> lam(seq.xpr(), negative, seq.pure());
            seq = detail::make_dynamic<BidiIter>(lam);
        }
        else if(lookbehind)
        {
            seq += detail::make_independent_end_xpression<BidiIter>(seq.pure());
            detail::lookbehind_matcher<xpr_type> lbm(seq.xpr(), seq.width().value(), negative, seq.pure());
            seq = detail::make_dynamic<BidiIter>(lbm);
        }
        else if(keeper) // independent sub-expression
        {
            seq += detail::make_independent_end_xpression<BidiIter>(seq.pure());
            detail::keeper_matcher<xpr_type> km(seq.xpr(), seq.pure());
            seq = detail::make_dynamic<BidiIter>(km);
        }

        // restore the modifiers
        this->traits_.flags(old_flags);
        return seq;
    }